

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O1

UniquePtr<EVP_PKEY> LoadPrivateKey(string *file)

{
  int iVar1;
  BIO_METHOD *type;
  EVP_PKEY *pEVar2;
  undefined8 *in_RSI;
  UniquePtr<BIO> bio;
  _Head_base<0UL,_bio_st_*,_false> local_18;
  
  type = BIO_s_file();
  local_18._M_head_impl = (bio_st *)BIO_new(type);
  if ((BIO *)local_18._M_head_impl != (BIO *)0x0) {
    iVar1 = BIO_read_filename(local_18._M_head_impl,(char *)*in_RSI);
    if (iVar1 != 0) {
      pEVar2 = PEM_read_bio_PrivateKey
                         ((BIO *)local_18._M_head_impl,(EVP_PKEY **)0x0,(undefined1 *)0x0,
                          (void *)0x0);
      goto LAB_00128984;
    }
  }
  (file->_M_dataplus)._M_p = (pointer)0x0;
  pEVar2 = (EVP_PKEY *)0x0;
LAB_00128984:
  (file->_M_dataplus)._M_p = (pointer)pEVar2;
  std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&local_18);
  return (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)file;
}

Assistant:

bssl::UniquePtr<EVP_PKEY> LoadPrivateKey(const std::string &file) {
  bssl::UniquePtr<BIO> bio(BIO_new(BIO_s_file()));
  if (!bio || !BIO_read_filename(bio.get(), file.c_str())) {
    return nullptr;
  }
  return bssl::UniquePtr<EVP_PKEY>(
      PEM_read_bio_PrivateKey(bio.get(), NULL, NULL, NULL));
}